

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_layout_ratio_from_pixel(nk_context *ctx,float pixel_width)

{
  nk_window *pnVar1;
  float local_2c;
  float local_28;
  float local_24;
  nk_window *win;
  float pixel_width_local;
  nk_context *ctx_local;
  float local_4;
  
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    local_4 = 0.0;
  }
  else {
    pnVar1 = ctx->current;
    if (1.0 <= pixel_width / (pnVar1->bounds).x) {
      local_24 = 1.0;
    }
    else {
      local_24 = pixel_width / (pnVar1->bounds).x;
    }
    if (0.0 <= local_24) {
      if (1.0 <= pixel_width / (pnVar1->bounds).x) {
        local_2c = 1.0;
      }
      else {
        local_2c = pixel_width / (pnVar1->bounds).x;
      }
      local_28 = local_2c;
    }
    else {
      local_28 = 0.0;
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

NK_API float
nk_layout_ratio_from_pixel(struct nk_context *ctx, float pixel_width)
{
struct nk_window *win;
NK_ASSERT(ctx);
NK_ASSERT(pixel_width);
if (!ctx || !ctx->current || !ctx->current->layout) return 0;
win = ctx->current;
return NK_CLAMP(0.0f, pixel_width/win->bounds.x, 1.0f);
}